

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderAtomicCountersTests.cpp
# Opt level: O0

bool __thiscall
glcts::BasicUsageCS::CheckProgram(BasicUsageCS *this,GLuint program,bool *compile_error)

{
  GLuint GVar1;
  undefined4 uVar2;
  GLsizei maxCount;
  size_type sVar3;
  reference pvVar4;
  reference pvVar5;
  allocator_type local_d1;
  undefined1 local_d0 [8];
  vector<char,_std::allocator<char>_> log_1;
  GLint length;
  vector<char,_std::allocator<char>_> log;
  undefined1 local_90 [8];
  vector<char,_std::allocator<char>_> source;
  int local_70;
  GLint length_1;
  GLint res;
  GLenum type;
  GLint i;
  allocator<unsigned_int> local_51;
  undefined1 local_50 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> shaders;
  int local_30;
  GLint attached_shaders;
  GLint status;
  GLint compile_status;
  bool *compile_error_local;
  BasicUsageCS *pBStack_18;
  GLuint program_local;
  BasicUsageCS *this_local;
  
  attached_shaders = 1;
  _status = compile_error;
  compile_error_local._4_4_ = program;
  pBStack_18 = this;
  glu::CallLogWrapper::glGetProgramiv
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             program,0x8b82,&local_30);
  if (local_30 == 0) {
    glu::CallLogWrapper::glGetProgramiv
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               compile_error_local._4_4_,0x8b85,
               (GLint *)((long)&shaders.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
    if (0 < shaders.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_) {
      sVar3 = (size_type)
              shaders.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._4_4_;
      std::allocator<unsigned_int>::allocator(&local_51);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50,sVar3,&local_51);
      std::allocator<unsigned_int>::~allocator(&local_51);
      GVar1 = compile_error_local._4_4_;
      maxCount = shaders.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._4_4_;
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50,0);
      glu::CallLogWrapper::glGetAttachedShaders
                (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,GVar1,maxCount,(GLsizei *)0x0,pvVar4);
      for (res = 0; res < shaders.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_; res = res + 1) {
        pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50,
                            (long)res);
        glu::CallLogWrapper::glGetShaderiv
                  (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,*pvVar4,0x8b4f,&length_1);
        if (length_1 == 0x8b30) {
          glcts::anon_unknown_0::Output("*** Fragment Shader ***\n");
        }
        else if (length_1 == 0x8b31) {
          glcts::anon_unknown_0::Output("*** Vertex Shader ***\n");
        }
        else if (length_1 == 0x8dd9) {
          glcts::anon_unknown_0::Output("*** Geometry Shader ***\n");
        }
        else if (length_1 == 0x8e87) {
          glcts::anon_unknown_0::Output("*** Tessellation Evaluation Shader ***\n");
        }
        else if (length_1 == 0x8e88) {
          glcts::anon_unknown_0::Output("*** Tessellation Control Shader ***\n");
        }
        else if (length_1 == 0x91b9) {
          glcts::anon_unknown_0::Output("*** Compute Shader ***\n");
        }
        else {
          glcts::anon_unknown_0::Output("*** Unknown Shader ***\n");
        }
        pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50,
                            (long)res);
        glu::CallLogWrapper::glGetShaderiv
                  (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,*pvVar4,0x8b81,&local_70);
        if (local_70 != 1) {
          attached_shaders = local_70;
        }
        pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50,
                            (long)res);
        glu::CallLogWrapper::glGetShaderiv
                  (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,*pvVar4,0x8b88,
                   (GLint *)&source.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             field_0x14);
        if (0 < (int)source.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_) {
          sVar3 = (size_type)
                  (int)source.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_;
          std::allocator<char>::allocator();
          std::vector<char,_std::allocator<char>_>::vector
                    ((vector<char,_std::allocator<char>_> *)local_90,sVar3,
                     (allocator_type *)
                     &log.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x17);
          std::allocator<char>::~allocator
                    ((allocator<char> *)
                     &log.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x17);
          pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50,
                              (long)res);
          uVar2 = source.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_;
          GVar1 = *pvVar4;
          pvVar5 = std::vector<char,_std::allocator<char>_>::operator[]
                             ((vector<char,_std::allocator<char>_> *)local_90,0);
          glu::CallLogWrapper::glGetShaderSource
                    (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,GVar1,uVar2,(GLsizei *)0x0,pvVar5);
          pvVar5 = std::vector<char,_std::allocator<char>_>::operator[]
                             ((vector<char,_std::allocator<char>_> *)local_90,0);
          glcts::anon_unknown_0::Output("%s\n",pvVar5);
          std::vector<char,_std::allocator<char>_>::~vector
                    ((vector<char,_std::allocator<char>_> *)local_90);
        }
        pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50,
                            (long)res);
        glu::CallLogWrapper::glGetShaderiv
                  (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,*pvVar4,0x8b84,
                   (GLint *)&source.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             field_0x14);
        if (0 < (int)source.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_) {
          sVar3 = (size_type)
                  (int)source.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_;
          std::allocator<char>::allocator();
          std::vector<char,_std::allocator<char>_>::vector
                    ((vector<char,_std::allocator<char>_> *)&length,sVar3,
                     (allocator_type *)
                     &log_1.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x17);
          std::allocator<char>::~allocator
                    ((allocator<char> *)
                     &log_1.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x17);
          pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50,
                              (long)res);
          uVar2 = source.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_;
          GVar1 = *pvVar4;
          pvVar5 = std::vector<char,_std::allocator<char>_>::operator[]
                             ((vector<char,_std::allocator<char>_> *)&length,0);
          glu::CallLogWrapper::glGetShaderInfoLog
                    (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,GVar1,uVar2,(GLsizei *)0x0,pvVar5);
          pvVar5 = std::vector<char,_std::allocator<char>_>::operator[]
                             ((vector<char,_std::allocator<char>_> *)&length,0);
          glcts::anon_unknown_0::Output("%s\n",pvVar5);
          std::vector<char,_std::allocator<char>_>::~vector
                    ((vector<char,_std::allocator<char>_> *)&length);
        }
      }
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50);
    }
    glu::CallLogWrapper::glGetProgramiv
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               compile_error_local._4_4_,0x8b84,
               (GLint *)&log_1.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10);
    if (0 < (int)log_1.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_) {
      sVar3 = (size_type)(int)log_1.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_;
      std::allocator<char>::allocator();
      std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)local_d0,sVar3,&local_d1);
      std::allocator<char>::~allocator(&local_d1);
      GVar1 = compile_error_local._4_4_;
      pvVar5 = std::vector<char,_std::allocator<char>_>::operator[]
                         ((vector<char,_std::allocator<char>_> *)local_d0,0);
      glu::CallLogWrapper::glGetProgramInfoLog
                (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,GVar1,
                 log_1.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_,(GLsizei *)0x0
                 ,pvVar5);
      pvVar5 = std::vector<char,_std::allocator<char>_>::operator[]
                         ((vector<char,_std::allocator<char>_> *)local_d0,0);
      glcts::anon_unknown_0::Output("%s\n",pvVar5);
      std::vector<char,_std::allocator<char>_>::~vector
                ((vector<char,_std::allocator<char>_> *)local_d0);
    }
  }
  if (_status != (bool *)0x0) {
    *_status = (bool)(-(attached_shaders != 1) & 1);
  }
  this_local._7_1_ = attached_shaders == 1 && local_30 == 1;
  return this_local._7_1_;
}

Assistant:

bool CheckProgram(GLuint program, bool* compile_error = NULL)
	{
		GLint compile_status = GL_TRUE;
		GLint status;
		glGetProgramiv(program, GL_LINK_STATUS, &status);

		if (status == GL_FALSE)
		{
			GLint attached_shaders;
			glGetProgramiv(program, GL_ATTACHED_SHADERS, &attached_shaders);

			if (attached_shaders > 0)
			{
				std::vector<GLuint> shaders(attached_shaders);
				glGetAttachedShaders(program, attached_shaders, NULL, &shaders[0]);

				for (GLint i = 0; i < attached_shaders; ++i)
				{
					GLenum type;
					glGetShaderiv(shaders[i], GL_SHADER_TYPE, reinterpret_cast<GLint*>(&type));
					switch (type)
					{
					case GL_VERTEX_SHADER:
						Output("*** Vertex Shader ***\n");
						break;
					case GL_TESS_CONTROL_SHADER:
						Output("*** Tessellation Control Shader ***\n");
						break;
					case GL_TESS_EVALUATION_SHADER:
						Output("*** Tessellation Evaluation Shader ***\n");
						break;
					case GL_GEOMETRY_SHADER:
						Output("*** Geometry Shader ***\n");
						break;
					case GL_FRAGMENT_SHADER:
						Output("*** Fragment Shader ***\n");
						break;
					case GL_COMPUTE_SHADER:
						Output("*** Compute Shader ***\n");
						break;
					default:
						Output("*** Unknown Shader ***\n");
						break;
					}

					GLint res;
					glGetShaderiv(shaders[i], GL_COMPILE_STATUS, &res);
					if (res != GL_TRUE)
						compile_status = res;

					// shader source
					GLint length;
					glGetShaderiv(shaders[i], GL_SHADER_SOURCE_LENGTH, &length);
					if (length > 0)
					{
						std::vector<GLchar> source(length);
						glGetShaderSource(shaders[i], length, NULL, &source[0]);
						Output("%s\n", &source[0]);
					}

					// shader info log
					glGetShaderiv(shaders[i], GL_INFO_LOG_LENGTH, &length);
					if (length > 0)
					{
						std::vector<GLchar> log(length);
						glGetShaderInfoLog(shaders[i], length, NULL, &log[0]);
						Output("%s\n", &log[0]);
					}
				}
			}

			// program info log
			GLint length;
			glGetProgramiv(program, GL_INFO_LOG_LENGTH, &length);
			if (length > 0)
			{
				std::vector<GLchar> log(length);
				glGetProgramInfoLog(program, length, NULL, &log[0]);
				Output("%s\n", &log[0]);
			}
		}

		if (compile_error)
			*compile_error = (compile_status == GL_TRUE ? false : true);
		if (compile_status != GL_TRUE)
			return false;
		return status == GL_TRUE ? true : false;
	}